

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDate __thiscall QDate::addMonths(QDate *this,int nmonths)

{
  long jd;
  int year;
  int iVar1;
  _Storage<long_long,_true> _Var2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int month;
  optional<long_long> oVar7;
  YearMonthDay YVar8;
  
  jd = this->jd;
  if (0xfffffe92c1eb868b < jd - 0xb69f248055U) {
    if (nmonths == 0) {
      return (QDate)jd;
    }
    YVar8 = QGregorianCalendar::partsFromJulian(jd);
    if (YVar8._0_8_ >> 0x20 != 0x80000000) {
      iVar3 = YVar8.month + nmonths;
      uVar5 = CONCAT44(iVar3,YVar8.year);
      if (iVar3 < 1) {
        do {
          uVar4 = (int)uVar5 - 1;
          uVar6 = (uVar5 & 0xffffffff00000000) + 0xc00000000;
          if (uVar4 == 0) {
            uVar6 = uVar5 & 0xffffffff00000000;
          }
          uVar5 = uVar6 | uVar4;
        } while ((int)(uVar6 >> 0x20) == 0 || (long)uVar6 < 0);
      }
      iVar3 = (int)(uVar5 >> 0x20);
      uVar6 = uVar5;
      while (year = (int)uVar6, 0xc < iVar3) {
        uVar5 = (uVar6 & 0xffffffff00000000) - 0xc00000000;
        uVar6 = year + 1 + (uint)(year == -1) | uVar5;
        iVar3 = (int)(uVar5 >> 0x20);
      }
      if (year != 0) {
        month = (int)(uVar5 >> 0x20);
        iVar1 = QGregorianCalendar::monthLength(month,year);
        iVar3 = YVar8.day;
        if (iVar1 < YVar8.day) {
          iVar3 = iVar1;
        }
        oVar7 = QGregorianCalendar::julianFromParts(year,month,iVar3);
        _Var2._M_value =
             oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
        if (_Var2._M_value - 0xb69f248055U < 0xfffffe92c1eb868c) {
          _Var2._M_value = -0x8000000000000000;
        }
        if (((undefined1  [16])
             oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          return (QDate)_Var2._M_value;
        }
      }
      return (QDate)-0x8000000000000000;
    }
  }
  return (QDate)-0x8000000000000000;
}

Assistant:

QDate QDate::addMonths(int nmonths) const
{
    if (isNull())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = QGregorianCalendar::partsFromJulian(jd);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year);

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year) // skip over year 0
            parts.month += 12;
    }
    while (parts.month > 12) {
        parts.month -= 12;
        if (!++parts.year) // skip over year 0
            ++parts.year;
    }

    return fixedDate(parts);
}